

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O2

void __thiscall
autoSimplification_nonRationalCoeff_Test::~autoSimplification_nonRationalCoeff_Test
          (autoSimplification_nonRationalCoeff_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, nonRationalCoeff)
{
    auto const x = symbol("x");
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const sqrt2 = n2 ^ fraction(1, 2);
    auto const e = n2 * x + n3 * x + sqrt2 * x;
    EXPECT_EQ(toString(e), "(+ (* 5 x) (* (^ 2 1/2) x))");
}